

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

Amount __thiscall cfd::core::AbstractTransaction::GetValueOut(AbstractTransaction *this)

{
  CfdException *this_00;
  Amount AVar1;
  allocator local_71;
  string local_70;
  CfdSourceLocation local_50;
  int local_34;
  wally_tx *pwStack_30;
  int ret;
  wally_tx *tx_pointer;
  uint64_t satoshi;
  AbstractTransaction *this_local;
  
  tx_pointer = (wally_tx *)0x0;
  pwStack_30 = (wally_tx *)this->wally_tx_pointer_;
  satoshi = (uint64_t)this;
  local_34 = wally_tx_get_total_output_satoshi(pwStack_30,(uint64_t *)&tx_pointer);
  if (local_34 != 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x262;
    local_50.funcname = "GetValueOut";
    logger::warn<int&>(&local_50,"wally_tx_get_total_output_satoshi NG[{}].",&local_34);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"total output calc error.",&local_71);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_70);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AVar1 = Amount::CreateBySatoshiAmount((int64_t)tx_pointer);
  return AVar1;
}

Assistant:

Amount AbstractTransaction::GetValueOut() const {
  uint64_t satoshi = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);

  int ret = wally_tx_get_total_output_satoshi(tx_pointer, &satoshi);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_total_output_satoshi NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "total output calc error.");
  }
  return Amount::CreateBySatoshiAmount(satoshi);
}